

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall
pbrt::StatsAccumulator::ReportPercentage
          (StatsAccumulator *this,char *name,int64_t num,int64_t denom)

{
  key_type *__k;
  mapped_type *pmVar1;
  long in_RCX;
  allocator<char> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  long local_20;
  
  __k = (key_type *)(*in_RDI + 0xc0);
  local_20 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,(char *)__k,in_RDX);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<long,_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<long,_long>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<long,_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<long,_long>_>_>_>
                         *)in_RSI,__k);
  pmVar1->first = (long)(in_RDX + pmVar1->first);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,(char *)__k,in_RDX);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<long,_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<long,_long>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<long,_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<long,_long>_>_>_>
                         *)in_RSI,__k);
  pmVar1->second = local_20 + pmVar1->second;
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  return;
}

Assistant:

void StatsAccumulator::ReportPercentage(const char *name, int64_t num, int64_t denom) {
    stats->percentages[name].first += num;
    stats->percentages[name].second += denom;
}